

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fat.cpp
# Opt level: O2

void __thiscall fat::print_directory(fat *this,int iteration_level,int32_t curr_dir)

{
  vector<fat::directory_info,_std::allocator<fat::directory_info>_> *this_00;
  int32_t iVar1;
  reference pvVar2;
  ostream *poVar3;
  int iVar4;
  int j;
  ulong __n;
  string indent;
  allocator local_55;
  int local_54;
  string local_50 [32];
  
  std::__cxx11::string::string(local_50,"",&local_55);
  iVar4 = 0;
  local_54 = iteration_level;
  if (0 < iteration_level) {
    iVar4 = iteration_level;
  }
  while (iVar4 != 0) {
    std::__cxx11::string::append((char *)local_50);
    iVar4 = iVar4 + -1;
  }
  this_00 = &this->dir_info;
  local_54 = local_54 + 1;
  for (__n = 0; __n < (ulong)((long)(this->dir_info).
                                    super__Vector_base<fat::directory_info,_std::allocator<fat::directory_info>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->dir_info).
                                    super__Vector_base<fat::directory_info,_std::allocator<fat::directory_info>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4); __n = __n + 1)
  {
    pvVar2 = std::vector<fat::directory_info,_std::allocator<fat::directory_info>_>::at(this_00,__n)
    ;
    if (pvVar2->parent_dir == curr_dir) {
      pvVar2 = std::vector<fat::directory_info,_std::allocator<fat::directory_info>_>::at
                         (this_00,__n);
      if (pvVar2->dir->is_file == true) {
        poVar3 = std::operator<<((ostream *)&std::cout,local_50);
        poVar3 = std::operator<<(poVar3,"-");
        pvVar2 = std::vector<fat::directory_info,_std::allocator<fat::directory_info>_>::at
                           (this_00,__n);
        poVar3 = std::operator<<(poVar3,pvVar2->dir->name);
        poVar3 = std::operator<<(poVar3," ");
        pvVar2 = std::vector<fat::directory_info,_std::allocator<fat::directory_info>_>::at
                           (this_00,__n);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar2->dir->start_cluster);
        poVar3 = std::operator<<(poVar3," ");
        pvVar2 = std::vector<fat::directory_info,_std::allocator<fat::directory_info>_>::at
                           (this_00,__n);
        iVar1 = get_cluster_count(this,pvVar2->dir->start_cluster);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,local_50);
        poVar3 = std::operator<<(poVar3,"+");
        pvVar2 = std::vector<fat::directory_info,_std::allocator<fat::directory_info>_>::at
                           (this_00,__n);
        poVar3 = std::operator<<(poVar3,pvVar2->dir->name);
        std::endl<char,std::char_traits<char>>(poVar3);
        pvVar2 = std::vector<fat::directory_info,_std::allocator<fat::directory_info>_>::at
                           (this_00,__n);
        print_directory(this,local_54,pvVar2->dir->start_cluster);
        poVar3 = std::operator<<((ostream *)&std::cout,local_50);
        poVar3 = std::operator<<(poVar3,"--");
      }
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void fat::print_directory(int iteration_level, int32_t curr_dir) {
    std::string indent = "";
    for (int i = 0; i < iteration_level; i++) {
        indent.append("\t");
    }
    for (int j = 0; j < dir_info.size(); j++) {
        if (dir_info.at(j).parent_dir == curr_dir) {
            if (dir_info.at(j).dir->is_file) {

                std::cout << indent << "-" << dir_info.at(j).dir->name << " " << dir_info.at(j).dir->start_cluster
                          << " " << get_cluster_count(dir_info.at(j).dir->start_cluster)
                          << std::endl;
            } else {
                std::cout << indent << "+" << dir_info.at(j).dir->name << std::endl;
                print_directory(iteration_level + 1, dir_info.at(j).dir->start_cluster);
                std::cout << indent << "--" << std::endl;
            }
        }
    }
}